

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageoutput.cc
# Opt level: O2

unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_> __thiscall
ImageOutput::create(ImageOutput *this,string *filename)

{
  uint __line;
  iterator iVar1;
  _func_int **pp_Var2;
  runtime_error *prVar3;
  char *__assertion;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string sStack_98;
  string format;
  pointer local_58;
  size_type sStack_50;
  string local_40;
  
  this->_vptr_ImageOutput = (_func_int **)0x0;
  if (filename->_M_string_length == 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"ImageOutput::create() called with no filename");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (Imageio::outputFormats_abi_cxx11_._40_8_ == 0) {
    Imageio::catalogBuiltinPlugins();
    if (Imageio::outputFormats_abi_cxx11_._40_8_ == 0) {
      __assertion = "!Imageio::outputFormats.empty() && \"No image output plugins compiled in.\"";
      __line = 0x2b;
      goto LAB_001bfa0e;
    }
  }
  std::__cxx11::string::rfind((char)filename,0x2e);
  std::__cxx11::string::substr((ulong)&sStack_98,(ulong)filename);
  std::__cxx11::string::string((string *)&format,(string *)&sStack_98);
  std::__cxx11::string::~string((string *)&sStack_98);
  if (format.super_string._M_string_length == 0) {
    std::__cxx11::string::string((string *)&sStack_98,(string *)filename);
    std::__cxx11::string::operator=((string *)&format,(string *)&sStack_98);
    std::__cxx11::string::~string((string *)&sStack_98);
  }
  Imageio::string::tolower(&local_40,(int)&format);
  std::__cxx11::string::~string((string *)&local_40);
  iVar1 = Imageio::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                  *)Imageio::outputFormats_abi_cxx11_,&format.super_string);
  if (iVar1._M_node == (_Base_ptr)(Imageio::outputFormats_abi_cxx11_ + 8)) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_58 = (filename->_M_dataplus)._M_p;
    sStack_50 = filename->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x56;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&sStack_98,
               (v10 *)
               "Could not find a format writer for \"{}\". Is it a file format that we don\'t know about?"
               ,fmt,args);
    std::runtime_error::runtime_error(prVar3,(string *)&sStack_98);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*(code **)(iVar1._M_node + 2) != (code *)0x0) {
    pp_Var2 = (_func_int **)(**(code **)(iVar1._M_node + 2))();
    this->_vptr_ImageOutput = pp_Var2;
    std::__cxx11::string::~string((string *)&format);
    return (__uniq_ptr_data<ImageOutput,_std::default_delete<ImageOutput>,_true,_true>)
           (__uniq_ptr_data<ImageOutput,_std::default_delete<ImageOutput>,_true,_true>)this;
  }
  __assertion = "createFunction != nullptr";
  __line = 0x44;
LAB_001bfa0e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/imageoutput.cc"
                ,__line,
                "static std::unique_ptr<ImageOutput> ImageOutput::create(const std::string &)");
}

Assistant:

std::unique_ptr<ImageOutput>
ImageOutput::create(const std::string& filename)
{
    std::unique_ptr<ImageOutput> out;
    if (filename.empty()) {  // Can't even guess if no name given
        throw std::runtime_error(
            "ImageOutput::create() called with no filename"
        );
    }

    // Populate outputFormats.
    if (Imageio::outputFormats.empty()) {
        Imageio::catalogBuiltinPlugins();
        assert(!Imageio::outputFormats.empty()
               && "No image output plugins compiled in.");
    }

    // Extract the file extension from the filename (without the leading dot)
    Imageio::string format = filename.substr(filename.find_last_of('.')+1);
    if (format.empty()) {
        // If the file had no extension, maybe it was itself the format name
        format = filename;
    }
    format.tolower();

    ImageOutput::Creator createFunction = nullptr;
    // See if it's already in the table.  If not, scan all plugins we can
    // find to populate the table.
    Imageio::OutputPluginMap::const_iterator found
            = Imageio::outputFormats.find(format);
    if (found != Imageio::outputFormats.end()) {
        createFunction = found->second;
    } else {
        throw std::runtime_error(
            fmt::format("Could not find a format writer for \"{}\". "
                    "Is it a file format that we don't know about?",
                    filename));
    }

    assert(createFunction != nullptr);
    out = std::unique_ptr<ImageOutput>(createFunction());
    return out;
}